

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  ImGuiTabBar *pIVar4;
  ImGuiPtrOrIndex *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiDockNode *pIVar8;
  ImGuiWindow *pIVar9;
  ImU32 col;
  ImGuiPtrOrIndex *__dest;
  int iVar10;
  int iVar11;
  uint uVar12;
  size_t __nmemb;
  ImDrawList *this;
  ImGuiTabBar *pIVar13;
  int iVar14;
  ImVec2 local_58;
  ImGuiPtrOrIndex *local_50;
  ImGuiDockNode *local_48;
  ImGuiWindow *local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  local_40 = GImGui->CurrentWindow;
  bVar2 = local_40->SkipItems;
  if (bVar2 == false) {
    local_48 = dock_node;
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar4 = (GImGui->TabBars).Buf.Data;
    iVar14 = -1;
    pIVar13 = tab_bar;
    if (pIVar4 <= tab_bar && tab_bar < pIVar4 + (GImGui->TabBars).Buf.Size) {
      iVar14 = (int)((ulong)((long)tab_bar - (long)pIVar4) >> 7);
      pIVar13 = (ImGuiTabBar *)0x0;
    }
    iVar11 = (pIVar7->CurrentTabBarStack).Size;
    iVar3 = (pIVar7->CurrentTabBarStack).Capacity;
    if (iVar11 == iVar3) {
      iVar11 = iVar11 + 1;
      if (iVar3 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar3 / 2 + iVar3;
      }
      if (iVar11 < iVar10) {
        iVar11 = iVar10;
      }
      if (iVar3 < iVar11) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar11 << 4);
        pIVar5 = (pIVar7->CurrentTabBarStack).Data;
        if (pIVar5 != (ImGuiPtrOrIndex *)0x0) {
          local_50 = __dest;
          memcpy(__dest,pIVar5,(long)(pIVar7->CurrentTabBarStack).Size << 4);
          MemFree((pIVar7->CurrentTabBarStack).Data);
          __dest = local_50;
        }
        (pIVar7->CurrentTabBarStack).Data = __dest;
        (pIVar7->CurrentTabBarStack).Capacity = iVar11;
      }
    }
    pIVar9 = local_40;
    pIVar8 = local_48;
    pIVar5 = (pIVar7->CurrentTabBarStack).Data;
    iVar11 = (pIVar7->CurrentTabBarStack).Size;
    pIVar5[iVar11].Ptr = pIVar13;
    pIVar5[iVar11].Index = iVar14;
    (pIVar7->CurrentTabBarStack).Size = (pIVar7->CurrentTabBarStack).Size + 1;
    pIVar7->CurrentTabBar = tab_bar;
    if (tab_bar->CurrFrameVisible != pIVar7->FrameCount) {
      if (((((flags & 1U) != 0) && ((tab_bar->Flags & 1) == 0)) &&
          (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < (long)__nmemb)) &&
         (tab_bar->PrevFrameVisible != -1)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x28,TabItemComparerByVisibleOffset);
      }
      uVar12 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar12 = flags;
      }
      tab_bar->Flags = uVar12;
      IVar6 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar6;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
      tab_bar->CurrFrameVisible = pIVar7->FrameCount;
      tab_bar->FramePadding = (pIVar7->Style).FramePadding;
      local_58.x = tab_bar->OffsetMaxIdeal;
      local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
      ItemSize(&local_58,(tab_bar->FramePadding).y);
      (pIVar9->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      col = GetColorU32((uint)((uVar12 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      local_58.y = (tab_bar->BarRect).Max.y + -1.0;
      if (pIVar8 == (ImGuiDockNode *)0x0) {
        local_38.x = (float)(int)((pIVar9->WindowPadding).x * 0.5);
        local_58.x = (tab_bar->BarRect).Min.x - local_38.x;
        local_38.x = (tab_bar->BarRect).Max.x + local_38.x;
        this = pIVar9->DrawList;
      }
      else {
        fVar1 = (pIVar8->Pos).x;
        local_58.x = fVar1 + pIVar9->WindowBorderSize;
        local_38.x = (fVar1 + (pIVar8->Size).x) - pIVar9->WindowBorderSize;
        this = pIVar9->DrawList;
      }
      local_38.y = local_58.y;
      ImDrawList::AddLine(this,&local_58,&local_38,col,1.0);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        //IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(tab_bar->OffsetMaxIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}